

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchARGBPMToRGBA32F<(QImage::Format)6>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  long lVar1;
  uint s;
  QRgbaFloat32 *pQVar2;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar3;
  int i;
  BPP bpp;
  undefined8 in_stack_ffffffffffffff98;
  int local_60;
  undefined8 local_28;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_60 = 0; local_60 < in_ECX; local_60 = local_60 + 1) {
    s = fetchPixel<(QPixelLayout::BPP)6>(in_RSI,in_EDX + local_60);
    convertPixelToARGB32PM<(QImage::Format)6>(s);
    QVar3 = QRgbaFloat<float>::fromArgb32((uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_28 = QVar3._0_8_;
    local_20 = QVar3._8_8_;
    pQVar2 = in_RDI + local_60;
    pQVar2->r = (float)(undefined4)local_28;
    pQVar2->g = (float)local_28._4_4_;
    pQVar2->b = (float)(undefined4)local_20;
    pQVar2->a = (float)local_20._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBPMToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                        const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i));
    return buffer;
}